

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDateTime QDateTime::fromString(QStringView string,DateFormat format)

{
  QStringView monthName;
  QLatin1StringView s;
  QDate date_00;
  QDate date_01;
  QDate date_02;
  QDate date_03;
  QStringView offsetString;
  QStringView offsetString_00;
  QStringView string_00;
  QStringView string_01;
  QStringView string_02;
  QStringView s_00;
  bool bVar1;
  int iVar2;
  qsizetype qVar5;
  QDate QVar6;
  int iVar3;
  int iVar4;
  size_type sVar7;
  QStringView *pQVar8;
  undefined4 in_ECX;
  Data in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar9;
  int offset_1;
  int month;
  int year;
  int day;
  int timePart;
  int yearPart;
  int i;
  int offset;
  bool found;
  int signIndex;
  int size;
  QDateTime *dateTime;
  QStringView tz;
  QTime time_1;
  QDate date_1;
  bool ok_1;
  iterator it;
  QTime time;
  bool isMidnight24;
  bool ok;
  QChar character;
  QStringView isoString;
  QTimeZone zone;
  QDate date;
  ParsedRfcDateTime rfc;
  TokenizerResult<const_QStringView_&,_char16_t> tokens;
  QVarLengthArray<QStringView,_6LL> parts;
  undefined4 in_stack_fffffffffffffc38;
  Initialization in_stack_fffffffffffffc3c;
  QVarLengthArray<QStringView,_6LL> *in_stack_fffffffffffffc40;
  int in_stack_fffffffffffffc48;
  CaseSensitivity in_stack_fffffffffffffc4c;
  undefined4 uVar10;
  QStringView *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined2 in_stack_fffffffffffffc5c;
  undefined2 uVar11;
  QChar in_stack_fffffffffffffc5e;
  undefined2 uVar12;
  undefined4 in_stack_fffffffffffffc60;
  QTime in_stack_fffffffffffffc64;
  QTime time_00;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 uVar13;
  undefined2 in_stack_fffffffffffffc6c;
  undefined2 uVar14;
  QChar in_stack_fffffffffffffc6e;
  undefined2 uVar15;
  undefined4 in_stack_fffffffffffffc78;
  int iVar16;
  int in_stack_fffffffffffffc7c;
  undefined8 in_stack_fffffffffffffc80;
  QTime time_01;
  undefined4 in_stack_fffffffffffffc88;
  int iVar17;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  undefined1 uVar18;
  undefined8 in_stack_fffffffffffffcb8;
  bool local_33b;
  QTimeZone *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  Data DVar19;
  DateFormat DVar20;
  undefined4 in_stack_fffffffffffffcf0;
  uint uVar21;
  undefined4 in_stack_fffffffffffffcf4;
  storage_type_conflict *in_stack_fffffffffffffcf8;
  int local_2cc;
  int local_2b0;
  qsizetype in_stack_fffffffffffffda0;
  storage_type_conflict *in_stack_fffffffffffffda8;
  storage_type_conflict *in_stack_fffffffffffffdb0;
  QTime local_1f4;
  undefined1 *local_1f0;
  qsizetype local_1e8;
  storage_type_conflict *psStack_1e0;
  byte local_1cd;
  QChar local_1cc;
  QChar local_1ca;
  undefined1 local_1c8 [58];
  undefined2 local_18e;
  int local_18c;
  qint64 local_188;
  qint64 local_180;
  qsizetype local_178;
  storage_type_conflict *psStack_170;
  QTime local_168;
  byte local_161;
  QStringView local_158;
  byte local_147;
  QChar local_146;
  QChar local_144;
  char16_t local_142;
  QChar local_132;
  QStringView local_130;
  QChar local_11c;
  QChar local_11a;
  QStringView local_118;
  undefined1 *local_100;
  qsizetype in_stack_ffffffffffffff08;
  storage_type_conflict *in_stack_ffffffffffffff10;
  undefined1 local_c0 [16];
  QStringView local_b0;
  undefined1 local_a0 [32];
  QVarLengthArray<QStringView,_6LL> local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar19 = in_RDI;
  bVar1 = QStringView::isEmpty((QStringView *)0x572f8b);
  if (bVar1) {
    QDateTime((QDateTime *)0x572f9e);
    goto LAB_00574053;
  }
  switch(in_ECX) {
  case 0:
    memset(&local_80,0xaa,0x78);
    QVarLengthArray<QStringView,_6LL>::QVarLengthArray(&local_80);
    local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a0._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a0._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_18e = 0x20;
    QStringView::tokenize<char16_t,Qt::SplitBehaviorFlags>
              (in_stack_fffffffffffffc50,
               (char16_t *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
               (SplitBehaviorFlags)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    memset(local_1c8,0xaa,0x38);
    QStringTokenizerBase<QStringView,_QChar>::begin
              ((QStringTokenizerBase<QStringView,_QChar> *)in_stack_fffffffffffffc40);
    local_2cc = 0;
    while( true ) {
      uVar18 = false;
      if (local_2cc < 6) {
        QStringTokenizerBase<QStringView,_QChar>::end
                  ((QStringTokenizerBase<QStringView,_QChar> *)local_a0);
        uVar18 = ::operator!=(local_1c8);
      }
      time_01.mds = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
      DVar20 = (DateFormat)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
      if ((bool)uVar18 == false) break;
      QStringTokenizerBase<QStringView,_QChar>::iterator::operator*((iterator *)0x5738e1);
      QVarLengthArray<QStringView,6ll>::emplace_back<QStringView_const&>
                (in_stack_fffffffffffffc40,
                 (QStringView *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      local_2cc = local_2cc + 1;
      QStringTokenizerBase<QStringView,_QChar>::iterator::operator++
                ((iterator *)in_stack_fffffffffffffc40);
    }
    sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
    if (sVar7 < 5) {
LAB_00573972:
      QDateTime((QDateTime *)0x57397f);
    }
    else {
      QStringTokenizerBase<QStringView,_QChar>::end
                ((QStringTokenizerBase<QStringView,_QChar> *)local_a0);
      bVar1 = ::operator!=(local_1c8);
      if (bVar1) goto LAB_00573972;
      QVarLengthArray<QStringView,_6LL>::at
                (in_stack_fffffffffffffc40,
                 CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
      QChar::QChar<char16_t,_true>(&local_1ca,L':');
      bVar1 = QStringView::contains
                        (in_stack_fffffffffffffc50,in_stack_fffffffffffffc6e,
                         in_stack_fffffffffffffc4c);
      if (bVar1) {
LAB_00573a6e:
        local_1cd = 0;
        QVarLengthArray<QStringView,_6LL>::at
                  (in_stack_fffffffffffffc40,
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        iVar2 = QStringView::toInt((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                   (bool *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
        iVar17 = iVar2;
        if ((local_1cd & 1) == 0) {
          iVar3 = 0;
        }
        else {
          pQVar8 = QVarLengthArray<QStringView,_6LL>::at
                             (in_stack_fffffffffffffc40,
                              CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
          time_01.mds = (int)((ulong)pQVar8 >> 0x20);
          iVar3 = QStringView::toInt((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                     (bool *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
          in_stack_fffffffffffffc7c = iVar3;
        }
        iVar16 = iVar3;
        pQVar8 = QVarLengthArray<QStringView,_6LL>::at
                           (in_stack_fffffffffffffc40,
                            CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        local_1e8 = pQVar8->m_size;
        psStack_1e0 = pQVar8->m_data;
        monthName.m_data._0_4_ = in_stack_fffffffffffffc58;
        monthName.m_size = (qsizetype)in_stack_fffffffffffffc50;
        monthName.m_data._4_2_ = in_stack_fffffffffffffc5c;
        monthName.m_data._6_2_ = in_stack_fffffffffffffc5e.ucs;
        iVar4 = fromShortMonthName(monthName);
        uVar14 = (undefined2)iVar4;
        uVar15 = (undefined2)((uint)iVar4 >> 0x10);
        if (((((local_1cd & 1) == 0) || (iVar3 == 0)) || (iVar2 == 0)) || (iVar4 < 1)) {
          QDateTime((QDateTime *)0x573b9b);
        }
        else {
          local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
          QDate::QDate((QDate *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc4c,
                       in_stack_fffffffffffffc48,(int)((ulong)in_stack_fffffffffffffc40 >> 0x20));
          bVar1 = QDate::isValid((QDate *)in_stack_fffffffffffffc50);
          uVar13 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc68);
          if (bVar1) {
            local_1f4.mds = -0x55555556;
            pQVar8 = QVarLengthArray<QStringView,_6LL>::at
                               (in_stack_fffffffffffffc40,
                                CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
            uVar10 = SUB84(pQVar8,0);
            time_00.mds = (int)((ulong)pQVar8 >> 0x20);
            string_02.m_data = in_stack_fffffffffffffdb0;
            string_02.m_size = (qsizetype)in_stack_fffffffffffffda8;
            local_1f4 = fromIsoTimeString(string_02,DVar20,
                                          (bool *)CONCAT17(uVar18,in_stack_fffffffffffffcb0));
            uVar11 = (undefined2)local_1f4.mds;
            uVar12 = (undefined2)((uint)local_1f4.mds >> 0x10);
            bVar1 = QTime::isValid(&local_1f4);
            if (bVar1) {
              sVar7 = QVLABaseBase::size((QVLABaseBase *)&local_80);
              if (sVar7 == 5) {
                date_03.jd._4_4_ = iVar17;
                date_03.jd._0_4_ = in_stack_fffffffffffffc88;
                QDateTime((QDateTime *)CONCAT44(time_00.mds,uVar10),date_03,time_01,
                          CONCAT22(uVar12,uVar11));
              }
              else {
                QVarLengthArray<QStringView,_6LL>::at
                          (in_stack_fffffffffffffc40,
                           CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
                Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                           (size_t)in_stack_fffffffffffffc40);
                QVar9.m_size._4_4_ = time_00.mds;
                QVar9.m_size._0_4_ = uVar10;
                QVar9.m_data._0_4_ = uVar13;
                QVar9.m_data._4_2_ = uVar14;
                QVar9.m_data._6_2_ = uVar15;
                bVar1 = QStringView::startsWith
                                  ((QStringView *)
                                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                                   QVar9,CaseInsensitive);
                if (!bVar1) {
                  QVar9 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)CONCAT44(in_stack_fffffffffffffc4c,
                                                      in_stack_fffffffffffffc48),
                                     (size_t)in_stack_fffffffffffffc40);
                  in_stack_fffffffffffffcf8 = (storage_type_conflict *)QVar9.m_size;
                  s.m_size._4_4_ = time_00.mds;
                  s.m_size._0_4_ = uVar10;
                  s.m_data._0_4_ = uVar13;
                  s.m_data._4_2_ = uVar14;
                  s.m_data._6_2_ = uVar15;
                  bVar1 = QStringView::startsWith
                                    ((QStringView *)
                                     CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),s
                                     ,CaseInsensitive);
                  if (!bVar1) {
                    QDateTime((QDateTime *)0x57401d);
                    goto LAB_00574028;
                  }
                }
                QStringView::sliced((QStringView *)CONCAT44(time_00.mds,uVar10),
                                    CONCAT26(uVar12,CONCAT24(uVar11,in_stack_fffffffffffffc58)));
                bVar1 = QStringView::isEmpty((QStringView *)0x573e38);
                if (bVar1) {
                  in_stack_fffffffffffffc40 =
                       (QVarLengthArray<QStringView,_6LL> *)&stack0xfffffffffffffdb0;
                  uVar10 = 1;
                  QTimeZone::QTimeZone
                            ((QTimeZone *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
                  date_01.jd._4_2_ = uVar14;
                  date_01.jd._0_4_ = uVar13;
                  date_01.jd._6_2_ = uVar15;
                  QDateTime((QDateTime *)CONCAT44(uVar10,in_stack_fffffffffffffc48),date_01,time_00,
                            (QTimeZone *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
                  QTimeZone::~QTimeZone((QTimeZone *)0x573eaf);
                }
                else {
                  offsetString_00.m_size._4_4_ = in_stack_fffffffffffffcf4;
                  offsetString_00.m_size._0_4_ = in_stack_fffffffffffffcf0;
                  offsetString_00.m_data = in_stack_fffffffffffffcf8;
                  fromOffsetString(offsetString_00,
                                   (bool *)CONCAT44(in_stack_fffffffffffffc7c,iVar16));
                  uVar21 = 0;
                  if ((local_1cd & 1) == 0) {
                    QDateTime((QDateTime *)0x573fb7);
                  }
                  else {
                    QTimeZone::fromSecondsAheadOfUtc(CONCAT22(uVar12,uVar11));
                    uVar21 = 0x1000000;
                    date_02.jd._4_2_ = uVar14;
                    date_02.jd._0_4_ = uVar13;
                    date_02.jd._6_2_ = uVar15;
                    QDateTime((QDateTime *)
                              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),date_02,
                              time_00,(QTimeZone *)in_stack_fffffffffffffc40,
                              in_stack_fffffffffffffc3c);
                  }
                  if ((uVar21 & 0x1000000) != 0) {
                    QTimeZone::~QTimeZone((QTimeZone *)0x573fd0);
                  }
                }
              }
            }
            else {
              QDateTime((QDateTime *)0x573ca1);
            }
          }
          else {
            QDateTime((QDateTime *)0x573c0b);
          }
        }
      }
      else {
        QVarLengthArray<QStringView,_6LL>::at
                  (in_stack_fffffffffffffc40,
                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        QChar::QChar<char16_t,_true>(&local_1cc,L':');
        bVar1 = QStringView::contains
                          (in_stack_fffffffffffffc50,in_stack_fffffffffffffc6e,
                           in_stack_fffffffffffffc4c);
        if (bVar1) goto LAB_00573a6e;
        QDateTime((QDateTime *)0x573a5c);
      }
    }
LAB_00574028:
    QVarLengthArray<QStringView,_6LL>::~QVarLengthArray(in_stack_fffffffffffffc40);
    break;
  case 1:
  case 9:
    qVar5 = QStringView::size(&local_b0);
    DVar20 = DVar19._4_4_;
    if ((int)qVar5 < 10) {
      QDateTime((QDateTime *)0x573216);
      break;
    }
    QStringView::first((QStringView *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                       0x57323c);
    string_00.m_data = in_stack_fffffffffffffda8;
    string_00.m_size = in_stack_fffffffffffffda0;
    QVar6 = QDate::fromString(string_00,DVar20);
    bVar1 = QDate::isValid((QDate *)in_stack_fffffffffffffc50);
    if (!bVar1) {
      QDateTime((QDateTime *)0x57328c);
      break;
    }
    if ((int)qVar5 == 10) {
      QDate::startOfDay((QDate *)CONCAT26(in_stack_fffffffffffffc6e.ucs,
                                          CONCAT24(in_stack_fffffffffffffc6c,
                                                   in_stack_fffffffffffffc68)));
      break;
    }
    local_100 = &DAT_aaaaaaaaaaaaaaaa;
    QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
    local_118.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
    local_118.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_118 = QStringView::sliced((QStringView *)
                                    CONCAT44(in_stack_fffffffffffffc64.mds,in_stack_fffffffffffffc60
                                            ),
                                    CONCAT26(in_stack_fffffffffffffc5e.ucs,
                                             CONCAT24(in_stack_fffffffffffffc5c,
                                                      in_stack_fffffffffffffc58)));
    qVar5 = QStringView::size(&local_118);
    if (qVar5 < 2) {
LAB_0057337e:
      QDateTime((QDateTime *)0x57338b);
    }
    else {
      QChar::QChar<char16_t,_true>(&local_11a,L'T');
      bVar1 = QStringView::startsWith
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                         in_stack_fffffffffffffc6e,CaseInsensitive);
      if (!bVar1) {
        QChar::QChar<char16_t,_true>(&local_11c,L' ');
        bVar1 = QStringView::startsWith(in_stack_fffffffffffffc50,in_stack_fffffffffffffc5e);
        if (!bVar1) goto LAB_0057337e;
      }
      local_130 = QStringView::sliced((QStringView *)
                                      CONCAT44(in_stack_fffffffffffffc64.mds,
                                               in_stack_fffffffffffffc60),
                                      CONCAT26(in_stack_fffffffffffffc5e.ucs,
                                               CONCAT24(in_stack_fffffffffffffc5c,
                                                        in_stack_fffffffffffffc58)));
      local_118 = local_130;
      QChar::QChar<char16_t,_true>(&local_132,L'Z');
      bVar1 = QStringView::endsWith
                        ((QStringView *)
                         CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                         in_stack_fffffffffffffc6e,CaseInsensitive);
      DVar20 = (DateFormat)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
      if (bVar1) {
        QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
        QTimeZone::operator=
                  ((QTimeZone *)in_stack_fffffffffffffc40,
                   (QTimeZone *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
        QTimeZone::~QTimeZone((QTimeZone *)0x573440);
        QStringView::chop(&local_118,1);
      }
      else {
        qVar5 = QStringView::size(&local_118);
        local_2b0 = (int)qVar5 + -1;
        do {
          local_142 = 0xaaaa;
          local_142 = (char16_t)
                      QStringView::operator[]
                                ((QStringView *)
                                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                                 (qsizetype)in_stack_fffffffffffffc40);
          QChar::QChar<char16_t,_true>(&local_144,L'+');
          bVar1 = ::operator==((QChar *)in_stack_fffffffffffffc40,
                               (QChar *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38
                                                ));
          local_33b = true;
          if (!bVar1) {
            QChar::QChar<char16_t,_true>(&local_146,L'-');
            local_33b = ::operator==((QChar *)in_stack_fffffffffffffc40,
                                     (QChar *)CONCAT44(in_stack_fffffffffffffc3c,
                                                       in_stack_fffffffffffffc38));
          }
          DVar20 = (DateFormat)((ulong)in_stack_fffffffffffffcb8 >> 0x20);
          bVar1 = false;
          if (local_33b == false) {
            local_2b0 = local_2b0 + -1;
            bVar1 = -1 < local_2b0;
          }
        } while (bVar1);
        if (local_33b != false) {
          local_147 = 0xaa;
          QStringView::sliced((QStringView *)
                              CONCAT44(in_stack_fffffffffffffc64.mds,in_stack_fffffffffffffc60),
                              CONCAT26(in_stack_fffffffffffffc5e.ucs,
                                       CONCAT24(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                                      ));
          offsetString.m_size._4_4_ = in_stack_fffffffffffffcf4;
          offsetString.m_size._0_4_ = in_stack_fffffffffffffcf0;
          offsetString.m_data = in_stack_fffffffffffffcf8;
          fromOffsetString(offsetString,
                           (bool *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78));
          if ((local_147 & 1) == 0) {
            QDateTime((QDateTime *)0x5735db);
            goto LAB_005737c7;
          }
          local_158 = QStringView::first((QStringView *)
                                         CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),0x57362a);
          local_118 = local_158;
          QTimeZone::fromSecondsAheadOfUtc
                    (CONCAT22(in_stack_fffffffffffffc5e.ucs,in_stack_fffffffffffffc5c));
          QTimeZone::operator=
                    ((QTimeZone *)in_stack_fffffffffffffc40,
                     (QTimeZone *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
          QTimeZone::~QTimeZone((QTimeZone *)0x573682);
        }
      }
      local_161 = 0;
      local_168.mds = -0x55555556;
      local_178 = local_118.m_size;
      psStack_170 = local_118.m_data;
      string_01.m_data = in_stack_fffffffffffffdb0;
      string_01.m_size = (qsizetype)in_stack_fffffffffffffda8;
      local_168 = fromIsoTimeString(string_01,DVar20,
                                    (bool *)CONCAT17(in_stack_fffffffffffffcb7,
                                                     in_stack_fffffffffffffcb0));
      bVar1 = QTime::isValid(&local_168);
      if (bVar1) {
        if ((local_161 & 1) == 0) {
          local_18c = local_168.mds;
          date_00.jd._4_2_ = in_stack_fffffffffffffc6c;
          date_00.jd._0_4_ = in_stack_fffffffffffffc68;
          date_00.jd._6_2_ = in_stack_fffffffffffffc6e.ucs;
          local_188 = QVar6.jd;
          QDateTime((QDateTime *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                    date_00,in_stack_fffffffffffffc64,(QTimeZone *)in_stack_fffffffffffffc40,
                    in_stack_fffffffffffffc3c);
        }
        else {
          local_180 = (qint64)QDate::addDays((QDate *)CONCAT44(in_stack_fffffffffffffc4c,
                                                               in_stack_fffffffffffffc48),
                                             (qint64)in_stack_fffffffffffffc40);
          QDate::startOfDay((QDate *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            in_stack_fffffffffffffcc8);
        }
      }
      else {
        QDateTime((QDateTime *)0x573700);
      }
    }
LAB_005737c7:
    QTimeZone::~QTimeZone((QTimeZone *)0x5737d4);
    break;
  default:
    QDateTime((QDateTime *)0x574053);
    break;
  case 8:
    local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_c0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    s_00.m_data = in_stack_ffffffffffffff10;
    s_00.m_size = in_stack_ffffffffffffff08;
    local_c0 = (undefined1  [16])rfcDateImpl(s_00);
    bVar1 = QDate::isValid((QDate *)in_stack_fffffffffffffc50);
    if ((bVar1) && (bVar1 = QTime::isValid((QTime *)(local_c0 + 8)), bVar1)) {
      *(undefined1 **)DVar19.d = &DAT_aaaaaaaaaaaaaaaa;
      QTimeZone::QTimeZone((QTimeZone *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      QVar6.jd._4_2_ = in_stack_fffffffffffffc6c;
      QVar6.jd._0_4_ = in_stack_fffffffffffffc68;
      QVar6.jd._6_2_ = in_stack_fffffffffffffc6e.ucs;
      QDateTime((QDateTime *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),QVar6,
                in_stack_fffffffffffffc64,(QTimeZone *)in_stack_fffffffffffffc40,
                in_stack_fffffffffffffc3c);
      QTimeZone::~QTimeZone((QTimeZone *)0x573109);
      QTimeZone::fromSecondsAheadOfUtc
                (CONCAT22(in_stack_fffffffffffffc5e.ucs,in_stack_fffffffffffffc5c));
      setTimeZone((QDateTime *)in_stack_fffffffffffffc40,
                  (QTimeZone *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),Reject)
      ;
      QTimeZone::~QTimeZone((QTimeZone *)0x573148);
    }
    else {
      QDateTime((QDateTime *)0x57306d);
    }
  }
LAB_00574053:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDateTime)in_RDI;
}

Assistant:

QDateTime QDateTime::fromString(QStringView string, Qt::DateFormat format)
{
    if (string.isEmpty())
        return QDateTime();

    switch (format) {
    case Qt::RFC2822Date: {
        const ParsedRfcDateTime rfc = rfcDateImpl(string);

        if (!rfc.date.isValid() || !rfc.time.isValid())
            return QDateTime();

        QDateTime dateTime(rfc.date, rfc.time, QTimeZone::UTC);
        dateTime.setTimeZone(QTimeZone::fromSecondsAheadOfUtc(rfc.utcOffset));
        return dateTime;
    }
    case Qt::ISODate:
    case Qt::ISODateWithMs: {
        const int size = string.size();
        if (size < 10)
            return QDateTime();

        QDate date = QDate::fromString(string.first(10), Qt::ISODate);
        if (!date.isValid())
            return QDateTime();
        if (size == 10)
            return date.startOfDay();

        QTimeZone zone = QTimeZone::LocalTime;
        QStringView isoString = string.sliced(10); // trim "yyyy-MM-dd"

        // Must be left with T (or space) and at least one digit for the hour:
        if (isoString.size() < 2
            || !(isoString.startsWith(u'T', Qt::CaseInsensitive)
                 // RFC 3339 (section 5.6) allows a space here.  (It actually
                 // allows any separator one considers more readable, merely
                 // giving space as an example - but let's not go wild !)
                 || isoString.startsWith(u' '))) {
            return QDateTime();
        }
        isoString = isoString.sliced(1); // trim 'T' (or space)

        // Check end of string for Time Zone definition, either Z for UTC or ±HH:mm for Offset
        if (isoString.endsWith(u'Z', Qt::CaseInsensitive)) {
            zone = QTimeZone::UTC;
            isoString.chop(1); // trim 'Z'
        } else {
            // the loop below is faster but functionally equal to:
            // const int signIndex = isoString.indexOf(QRegulargExpression(QStringLiteral("[+-]")));
            int signIndex = isoString.size() - 1;
            Q_ASSERT(signIndex >= 0);
            bool found = false;
            do {
                QChar character(isoString[signIndex]);
                found = character == u'+' || character == u'-';
            } while (!found && --signIndex >= 0);

            if (found) {
                bool ok;
                int offset = fromOffsetString(isoString.sliced(signIndex), &ok);
                if (!ok)
                    return QDateTime();
                isoString = isoString.first(signIndex);
                zone = QTimeZone::fromSecondsAheadOfUtc(offset);
            }
        }

        // Might be end of day (24:00, including variants), which QTime considers invalid.
        // ISO 8601 (section 4.2.3) says that 24:00 is equivalent to 00:00 the next day.
        bool isMidnight24 = false;
        QTime time = fromIsoTimeString(isoString, format, &isMidnight24);
        if (!time.isValid())
            return QDateTime();
        if (isMidnight24) // time is 0:0, but we want the start of next day:
            return date.addDays(1).startOfDay(zone);
        return QDateTime(date, time, zone);
    }
    case Qt::TextDate: {
        QVarLengthArray<QStringView, 6> parts;

        auto tokens = string.tokenize(u' ', Qt::SkipEmptyParts);
        auto it = tokens.begin();
        for (int i = 0; i < 6 && it != tokens.end(); ++i, ++it)
            parts.emplace_back(*it);

        // Documented as "ddd MMM d HH:mm:ss yyyy" with optional offset-suffix;
        // and allow time either before or after year.
        if (parts.size() < 5 || it != tokens.end())
            return QDateTime();

        // Year and time can be in either order.
        // Guess which by looking for ':' in the time
        int yearPart = 3;
        int timePart = 3;
        if (parts.at(3).contains(u':'))
            yearPart = 4;
        else if (parts.at(4).contains(u':'))
            timePart = 4;
        else
            return QDateTime();

        bool ok = false;
        int day = parts.at(2).toInt(&ok);
        int year = ok ? parts.at(yearPart).toInt(&ok) : 0;
        int month = fromShortMonthName(parts.at(1));
        if (!ok || year == 0 || day == 0 || month < 1)
            return QDateTime();

        const QDate date(year, month, day);
        if (!date.isValid())
            return QDateTime();

        const QTime time = fromIsoTimeString(parts.at(timePart), format, nullptr);
        if (!time.isValid())
            return QDateTime();

        if (parts.size() == 5)
            return QDateTime(date, time);

        QStringView tz = parts.at(5);
        if (tz.startsWith("UTC"_L1)
            // GMT has long been deprecated as an alias for UTC.
            || tz.startsWith("GMT"_L1, Qt::CaseInsensitive)) {
            tz = tz.sliced(3);
            if (tz.isEmpty())
                return QDateTime(date, time, QTimeZone::UTC);

            int offset = fromOffsetString(tz, &ok);
            return ok ? QDateTime(date, time, QTimeZone::fromSecondsAheadOfUtc(offset))
                      : QDateTime();
        }
        return QDateTime();
    }
    }

    return QDateTime();
}